

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

TestSpec * Catch::parseTestSpec(string *arg)

{
  TestSpecParser *in_RDI;
  TestSpecParser *this;
  TestSpecParser *this_00;
  string *in_stack_ffffffffffffff18;
  TestSpecParser *in_stack_ffffffffffffff20;
  
  this = in_RDI;
  ITagAliasRegistry::get();
  this_00 = (TestSpecParser *)&stack0xffffffffffffff08;
  TestSpecParser::TestSpecParser(this,(ITagAliasRegistry *)in_RDI);
  TestSpecParser::parse(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TestSpecParser::testSpec(this_00);
  TestSpecParser::~TestSpecParser(this);
  return (TestSpec *)this;
}

Assistant:

TestSpec parseTestSpec( std::string const& arg ) {
        return TestSpecParser( ITagAliasRegistry::get() ).parse( arg ).testSpec();
    }